

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [39];
  byte local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [35];
  byte local_75;
  string local_68 [39];
  byte local_41;
  string local_40 [32];
  long local_20;
  size_type pos;
  text *arg_local;
  
  pos = (size_type)arg;
  arg_local = &__return_storage_ptr__->first;
  local_20 = std::__cxx11::string::rfind((char)arg,0x3d);
  local_41 = 0;
  local_75 = 0;
  local_99 = 0;
  if (local_20 == -1) {
    std::__cxx11::string::string(local_40,(string *)arg);
    local_41 = 1;
    std::__cxx11::string::string(local_68);
    local_75 = 1;
    std::make_pair<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  }
  else {
    std::__cxx11::string::substr((ulong)local_98,(ulong)arg);
    local_99 = 1;
    std::__cxx11::string::substr((ulong)local_c0,(ulong)arg);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,local_98,local_c0);
    std::__cxx11::string::~string((string *)local_c0);
  }
  if ((local_99 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_98);
  }
  if ((local_75 & 1) != 0) {
    std::__cxx11::string::~string(local_68);
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<text, text>
split_option( text arg )
{
    text::size_type pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_pair( arg, text() )
                : std::make_pair( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}